

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdShift<int,int>(Thread *this,BinopFunc<int,_int> *f)

{
  Simd<int,_(unsigned_char)__x04_> value;
  uint uVar1;
  int iVar2;
  int *piVar3;
  byte local_3d;
  undefined1 auStack_3c [7];
  u8 i;
  SR result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  uint amount;
  BinopFunc<int,_int> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_int>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  for (local_3d = 0; local_3d < 4; local_3d = local_3d + 1) {
    piVar3 = Simd<int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<int,_(unsigned_char)__x04_> *)(result.v + 2),local_3d);
    iVar2 = (*f)(*piVar3,uVar1);
    piVar3 = Simd<int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<int,_(unsigned_char)__x04_> *)auStack_3c,local_3d);
    *piVar3 = iVar2;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = auStack_3c._0_4_;
  value.v[1] = stack0xffffffffffffffc8;
  Push<wabt::interp::Simd<int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}